

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_make_copynode(MDD ifeq,MDD ifneq)

{
  long *plVar1;
  FILE *__stream;
  MDD MVar2;
  size_t sVar3;
  ulong b;
  long in_FS_OFFSET;
  int created;
  
  b = ifeq << 0x11 | 0x10000;
  MVar2 = llmsset_lookup(nodes,ifneq * 2,b,&created);
  if (MVar2 == 0) {
    lddmc_refs_push(ifeq);
    lddmc_refs_push(ifneq);
    sylvan_gc_RUN();
    plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
    *plVar1 = *plVar1 + -8;
    MVar2 = llmsset_lookup(nodes,ifneq * 2,b,&created);
    __stream = _stderr;
    if (MVar2 == 0) {
      sVar3 = llmsset_count_marked_RUN(nodes);
      fprintf(__stream,"MDD Unique table full, %zu of %zu buckets filled!\n",sVar3,nodes->table_size
             );
      exit(1);
    }
  }
  return MVar2;
}

Assistant:

MDD
lddmc_make_copynode(MDD ifeq, MDD ifneq)
{
    struct mddnode n;
    mddnode_makecopy(&n, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}